

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_visit_message_with_multiple_chars_message_type_Test::TestBody
          (visitor_test_should_visit_message_with_multiple_chars_message_type_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [8];
  VisitError<typename_Visitor::ResultType> err;
  char *frame;
  visitor_test_should_visit_message_with_multiple_chars_message_type_Test *this_local;
  
  err.storage_._48_8_ = anon_var_dwarf_569c7;
  doVisit<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
            ((Result<void,_Fixpp::ErrorKind> *)local_58,
             "8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248");
  local_71 = Fixpp::result::Result<void,_Fixpp::ErrorKind>::isOk
                       ((Result<void,_Fixpp::ErrorKind> *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_70,(AssertionResult *)"err.isOk()","false","true",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x36a,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_58)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_visit_message_with_multiple_chars_message_type)
{
    const char* frame = "8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248";

    auto err = doVisit(frame, should_visit_message_with_multiple_chars_message_type::Visitor(), should_visit_message_with_multiple_chars_message_type::VisitRules());
    ASSERT_TRUE(err.isOk());
}